

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_backup_sb_state(SB_FIRST_PASS_STATS *sb_fp_stats,AV1_COMP *cpi,ThreadData_conflict *td,
                        TileDataEnc *tile_data,int mi_row,int mi_col)

{
  uint8_t uVar1;
  BLOCK_SIZE bsize;
  SequenceHeader *pSVar2;
  
  pSVar2 = (cpi->common).seq_params;
  uVar1 = pSVar2->monochrome;
  bsize = pSVar2->sb_size;
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  av1_save_context(&td->mb,&sb_fp_stats->x_ctx,mi_row,mi_col,bsize,(uint)(uVar1 == '\0') * 2 + 1);
  memcpy(&sb_fp_stats->rd_count,&td->rd_counts,0x598);
  sb_fp_stats->split_count = (td->mb).txfm_search_info.txb_split_count;
  memcpy(&sb_fp_stats->fc,td->counts,0xc0);
  if ((cpi->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
    memcpy(sb_fp_stats->inter_mode_rd_models,tile_data->inter_mode_rd_models,0x9a0);
  }
  memcpy(sb_fp_stats->thresh_freq_fact,(td->mb).thresh_freq_fact,0x3a18);
  sb_fp_stats->current_qindex =
       (cpi->common).mi_params.mi_alloc
       [(mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [(cpi->common).mi_params.mi_alloc_bsize]) *
        (cpi->common).mi_params.mi_alloc_stride +
        mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [(cpi->common).mi_params.mi_alloc_bsize]].current_qindex;
  return;
}

Assistant:

void av1_backup_sb_state(SB_FIRST_PASS_STATS *sb_fp_stats, const AV1_COMP *cpi,
                         ThreadData *td, const TileDataEnc *tile_data,
                         int mi_row, int mi_col) {
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const TileInfo *tile_info = &tile_data->tile_info;

  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  av1_save_context(x, &sb_fp_stats->x_ctx, mi_row, mi_col, sb_size, num_planes);

  sb_fp_stats->rd_count = td->rd_counts;
  sb_fp_stats->split_count = x->txfm_search_info.txb_split_count;

  sb_fp_stats->fc = *td->counts;

  // Don't copy in row_mt case, otherwise run into data race. No behavior change
  // in row_mt case.
  if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
    memcpy(sb_fp_stats->inter_mode_rd_models, tile_data->inter_mode_rd_models,
           sizeof(sb_fp_stats->inter_mode_rd_models));
  }

  memcpy(sb_fp_stats->thresh_freq_fact, x->thresh_freq_fact,
         sizeof(sb_fp_stats->thresh_freq_fact));

  const int alloc_mi_idx = get_alloc_mi_idx(&cm->mi_params, mi_row, mi_col);
  sb_fp_stats->current_qindex =
      cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex;

#if CONFIG_INTERNAL_STATS
  memcpy(sb_fp_stats->mode_chosen_counts, cpi->mode_chosen_counts,
         sizeof(sb_fp_stats->mode_chosen_counts));
#endif  // CONFIG_INTERNAL_STATS
}